

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O0

void __thiscall QFbWindow::repaint(QFbWindow *this,QRegion *region)

{
  bool bVar1;
  long lVar2;
  QFbScreen *pQVar3;
  QFbWindow *in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  QRect rect;
  QPoint topLeft;
  QRect oldGeometryLocal;
  QRect currentGeometry;
  QRect *in_stack_ffffffffffffff78;
  long local_70;
  QRect in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.x1.m_i = -0x55555556;
  local_18.y1.m_i = -0x55555556;
  local_18.x2.m_i = -0x55555556;
  local_18.y2.m_i = -0x55555556;
  local_18 = (QRect)(**(code **)(*(long *)in_RDI + 0x30))();
  local_28._0_4_ = (in_RDI->mOldGeometry).x1;
  local_28._4_4_ = (in_RDI->mOldGeometry).y1;
  local_20._0_4_ = (in_RDI->mOldGeometry).x2;
  local_20._4_4_ = (in_RDI->mOldGeometry).y2;
  in_RDI->mOldGeometry = local_18;
  bVar1 = ::operator!=((QRect *)in_RDI,in_stack_ffffffffffffff78);
  if (bVar1) {
    pQVar3 = platformScreen(in_RDI);
    (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,&local_28);
  }
  QRect::topLeft(in_stack_ffffffffffffff78);
  local_70 = QRegion::begin();
  lVar2 = QRegion::end();
  for (; local_70 != lVar2; local_70 = local_70 + 0x10) {
    pQVar3 = platformScreen(in_RDI);
    in_stack_ffffffffffffffb0 =
         QRect::translated(in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0._0_8_);
    (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,&stack0xffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbWindow::repaint(const QRegion &region)
{
    const QRect currentGeometry = geometry();
    const QRect oldGeometryLocal = mOldGeometry;
    mOldGeometry = currentGeometry;
    // If this is a move, redraw the previous location
    if (oldGeometryLocal != currentGeometry)
        platformScreen()->setDirty(oldGeometryLocal);
    auto topLeft = currentGeometry.topLeft();
    for (auto rect : region)
        platformScreen()->setDirty(rect.translated(topLeft));
}